

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O1

void __thiscall FIX::SessionID::SessionID(SessionID *this)

{
  StringField::StringField((StringField *)this,8);
  (this->m_beginString).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00328470;
  StringField::StringField(&(this->m_senderCompID).super_StringField,0x31);
  (this->m_senderCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00327af0;
  StringField::StringField(&(this->m_targetCompID).super_StringField,0x38);
  (this->m_targetCompID).super_StringField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00327ee0;
  (this->m_sessionQualifier)._M_dataplus._M_p = (pointer)&(this->m_sessionQualifier).field_2;
  (this->m_sessionQualifier)._M_string_length = 0;
  (this->m_sessionQualifier).field_2._M_local_buf[0] = '\0';
  (this->m_frozenString)._M_dataplus._M_p = (pointer)&(this->m_frozenString).field_2;
  (this->m_frozenString)._M_string_length = 0;
  (this->m_frozenString).field_2._M_local_buf[0] = '\0';
  toString(this,&this->m_frozenString);
  return;
}

Assistant:

SessionID() { toString(m_frozenString); }